

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::bit<(unsigned_char)1,(SM83::Registers)2>(SM83 *this)

{
  u8 data;
  bool bVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_char,_char>
  fmt;
  anon_union_2_2_fd64ea96_for_SM83_2 *args;
  uchar local_2a;
  undefined1 local_29 [6];
  u8 reg;
  char *local_20;
  SM83 *local_18;
  SM83 *this_local;
  
  stack0xffffffffffffffd8 =
       "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  BIT {}, {}\n";
  local_20 = (char *)0x48;
  args = &this->field_1;
  local_29[0] = 1;
  local_18 = this;
  local_2a = Get8bitRegisterName<(SM83::Registers)2>(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = local_20;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char,char>
            ((v11 *)stack0xffffffffffffffd8,fmt,&args->bc,&(this->field_2).de,&(this->field_3).hl,
             &this->sp,&this->pc_at_opcode,(unsigned_short *)local_29,&local_2a,(char *)&args->bc);
  data = Get8bitRegister<(SM83::Registers)2>(this);
  bVar1 = Common::IsBitSet<(unsigned_char)__x01_,_unsigned_char>(data);
  SetZeroFlag(this,(bool)((bVar1 ^ 0xffU) & 1));
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,true);
  return;
}

Assistant:

void SM83::bit() {
    LTRACE("BIT {}, {}", Bit, Get8bitRegisterName<Register>());
    const u8 reg = Get8bitRegister<Register>();

    SetZeroFlag(!Common::IsBitSet<Bit>(reg));
    SetNegateFlag(false);
    SetHalfCarryFlag(true);
}